

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asciimidi.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  string *psVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  uint index;
  bool bVar3;
  MidiFile midifile;
  Options options;
  MidiFile local_180;
  Options local_110;
  
  smf::MidiFile::MidiFile(&local_180);
  smf::Options::Options(&local_110);
  checkOptions(&local_110,argc,argv);
  uVar1 = smf::Options::getArgCount(&local_110);
  if (uVar1 == 0) {
    smf::MidiFile::read(&local_180,0x1342e0,__buf,in_RCX);
    printAscii(&local_180,&local_110);
  }
  else if (0 < (int)uVar1) {
    index = 1;
    do {
      psVar2 = smf::Options::getArg_abi_cxx11_(&local_110,index);
      smf::MidiFile::read(&local_180,(int)psVar2,__buf_00,in_RCX);
      printAscii(&local_180,&local_110);
      if ((int)index < (int)uVar1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n\n\n",3);
      }
      in_RCX = (size_t)(index + 1);
      bVar3 = index != uVar1;
      index = index + 1;
    } while (bVar3);
  }
  smf::Options::~Options(&local_110);
  smf::MidiFile::~MidiFile(&local_180);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
	MidiFile midifile;
	Options options;
	checkOptions(options, argc, argv);
	int filecount = options.getArgCount();
	if (filecount == 0) {
			midifile.read(cin);
			printAscii(midifile, options);
	} else {
		for (int i=1; i<=filecount; i++) {
			midifile.read(options.getArg(i));
			printAscii(midifile, options);
			if (i < filecount) {
				cout << "\n\n\n";
			}
		}
	}

	return 0;
}